

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int parse_base128_integer(CBS *cbs,uint64_t *out)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  uint8_t b;
  size_t sVar4;
  
  sVar4 = cbs->len;
  uVar3 = 0;
  while( true ) {
    if (sVar4 == 0) {
      return 0;
    }
    pbVar2 = cbs->data;
    cbs->data = pbVar2 + 1;
    sVar4 = sVar4 - 1;
    cbs->len = sVar4;
    bVar1 = *pbVar2;
    if (uVar3 >> 0x39 != 0) break;
    uVar3 = (ulong)(bVar1 & 0x7f) | uVar3 << 7;
    if (-1 < (char)bVar1) {
      *out = uVar3;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int parse_base128_integer(CBS *cbs, uint64_t *out) {
  uint64_t v = 0;
  uint8_t b;
  do {
    if (!CBS_get_u8(cbs, &b)) {
      return 0;
    }
    if ((v >> (64 - 7)) != 0) {
      // The value is too large.
      return 0;
    }
    if (v == 0 && b == 0x80) {
      // The value must be minimally encoded.
      return 0;
    }
    v = (v << 7) | (b & 0x7f);

    // Values end at an octet with the high bit cleared.
  } while (b & 0x80);

  *out = v;
  return 1;
}